

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

int Col_RopeIterCompare(ColRopeIterator *it1,ColRopeIterator *it2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (it2->index <= it1->index) {
    uVar1 = (uint)(it2->index < it1->index);
  }
  return uVar1;
}

Assistant:

int
Col_RopeIterCompare(
    const Col_RopeIterator it1, /*!< First iterator. */
    const Col_RopeIterator it2) /*!< Second iterator. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPEITER,it1} */
    TYPECHECK_ROPEITER(it1) return 1;

    /*! @typecheck{COL_ERROR_ROPEITER,it2} */
    TYPECHECK_ROPEITER(it2) return -1;

    if (it1->index < it2->index) {
        /*! @retval -1 if **it1** before **it2**. */
        return -1;
    } else if (it1->index > it2->index) {
        /*! @retval 1 if **it1** after **it2**. */
        return 1;
    } else {
        /*! @retval 0 if **it1** and **it2** are equal. */
        return 0;
    }
}